

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QPalette>_>::findOrInsert<QByteArray>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<QByteArray,_QPalette>_> *this,QByteArray *key)

{
  Span *pSVar1;
  bool bVar2;
  size_t hash;
  Bucket BVar3;
  QByteArrayView QVar4;
  
  QVar4.m_data = (key->d).ptr;
  QVar4.m_size = (key->d).size;
  hash = qHash(QVar4,this->seed);
  if (this->numBuckets == 0) {
    BVar3 = (Bucket)ZEXT816(0);
  }
  else {
    BVar3 = findBucketWithHash<QByteArray>(this,key,hash);
    bVar2 = true;
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) goto LAB_002c46e7;
  }
  if (this->numBuckets >> 1 <= this->size) {
    rehash(this,this->size + 1);
    BVar3 = findBucketWithHash<QByteArray>(this,key,hash);
  }
  Span<QHashPrivate::Node<QByteArray,_QPalette>_>::insert(BVar3.span,BVar3.index);
  this->size = this->size + 1;
  bVar2 = false;
LAB_002c46e7:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar3.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar3.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }